

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
* google::protobuf::compiler::cpp::anon_unknown_0::SortFieldsByNumber
            (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *__return_storage_ptr__,Descriptor *descriptor)

{
  pointer ppFVar1;
  pointer ppFVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  pointer ppFVar7;
  allocator_type local_21;
  
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(__return_storage_ptr__,(long)*(int *)(descriptor + 0x2c),&local_21);
  uVar5 = 0;
  uVar4 = (ulong)*(uint *)(descriptor + 0x2c);
  if ((int)*(uint *)(descriptor + 0x2c) < 1) {
    uVar4 = uVar5;
  }
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    (__return_storage_ptr__->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_start[uVar6] =
         (FieldDescriptor *)(*(long *)(descriptor + 0x30) + uVar5);
    uVar5 = uVar5 + 0xa8;
  }
  ppFVar1 = (__return_storage_ptr__->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (__return_storage_ptr__->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar1 != ppFVar2) {
    uVar4 = (long)ppFVar2 - (long)ppFVar1 >> 3;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
              (ppFVar1,ppFVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppFVar2 - (long)ppFVar1 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar1,ppFVar2);
    }
    else {
      ppFVar7 = ppFVar1 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
                (ppFVar1,ppFVar7);
      for (; ppFVar7 != ppFVar2; ppFVar7 = ppFVar7 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldOrderingByNumber>>
                  (ppFVar7);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const FieldDescriptor*> SortFieldsByNumber(
    const Descriptor* descriptor) {
  std::vector<const FieldDescriptor*> fields(descriptor->field_count());
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  std::sort(fields.begin(), fields.end(), FieldOrderingByNumber());
  return fields;
}